

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_rowcol_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  int *piVar2;
  uint *puVar3;
  undefined4 *puVar4;
  uint uVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  uint uVar15;
  parasail_result_t *ppVar16;
  __m128i *ptr;
  int32_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  char *pcVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  int32_t iVar27;
  ulong uVar28;
  char *__format;
  uint uVar29;
  __m128i *palVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  int iVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  int iVar45;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  __m128i alVar46;
  undefined1 auVar47 [16];
  int iVar48;
  int iVar49;
  ulong uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  __m128i alVar55;
  int iVar56;
  uint uVar57;
  int iVar58;
  int iVar59;
  uint uVar60;
  int iVar61;
  int iVar62;
  uint uVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  uint uVar73;
  int iVar74;
  uint uVar75;
  int iVar76;
  uint uVar77;
  int iVar78;
  uint uVar79;
  uint local_c8;
  __m128i_32_t e;
  __m128i_32_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar23 = "profile";
  }
  else {
    pvVar6 = (profile->profile32).score;
    if (pvVar6 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar23 = "profile->profile32.score";
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar23 = "profile->matrix";
      }
      else {
        uVar5 = profile->s1Len;
        if ((int)uVar5 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar23 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar23 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar23 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar23 = "open";
        }
        else {
          if (-1 < gap) {
            uVar25 = uVar5 - 1;
            uVar33 = (ulong)uVar5 + 3 >> 2;
            iVar21 = (int)(uVar25 / uVar33);
            iVar34 = -open;
            iVar31 = ppVar7->min;
            uVar18 = 0x80000000 - iVar31;
            if (iVar31 != iVar34 && SBORROW4(iVar31,iVar34) == iVar31 + open < 0) {
              uVar18 = open | 0x80000000;
            }
            uVar15 = 0x7ffffffe - ppVar7->max;
            ppVar16 = parasail_result_new_rowcol1((uint)((ulong)uVar5 + 3) & 0x7ffffffc,s2Len);
            if (ppVar16 != (parasail_result_t *)0x0) {
              ppVar16->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar16->flag | 0x4440402;
              ptr = parasail_memalign___m128i(0x10,uVar33);
              ptr_00 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m128i(0x10,uVar33);
              ptr_02 = parasail_memalign___m128i(0x10,uVar33);
              ptr_03 = parasail_memalign___m128i(0x10,uVar33);
              uVar28 = 0;
              if (ptr_03 != (__m128i *)0x0 &&
                  ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                  (ptr_00 != (int32_t *)0x0 && ptr != (__m128i *)0x0))) {
                iVar17 = s2Len + -1;
                iVar24 = 3 - iVar21;
                uVar18 = uVar18 + 1;
                auVar36._4_4_ = uVar18;
                auVar36._0_4_ = uVar18;
                auVar36._8_4_ = uVar18;
                auVar36._12_4_ = uVar18;
                uVar29 = (uint)uVar33;
                iVar19 = -(uVar29 * gap);
                iVar31 = iVar34;
                for (; uVar28 != uVar33; uVar28 = uVar28 + 1) {
                  iVar32 = iVar31;
                  for (lVar22 = 0; lVar22 != 4; lVar22 = lVar22 + 1) {
                    iVar45 = 0;
                    if (s1_beg == 0) {
                      iVar45 = iVar32;
                    }
                    *(int *)((long)&h + lVar22 * 4) = iVar45;
                    lVar26 = (long)iVar45 - (ulong)(uint)open;
                    if (lVar26 < -0x7fffffff) {
                      lVar26 = -0x80000000;
                    }
                    *(int *)((long)&e + lVar22 * 4) = (int)lVar26;
                    iVar32 = iVar32 - uVar29 * gap;
                  }
                  ptr_02[uVar28][0] = h.m[0];
                  ptr_02[uVar28][1] = h.m[1];
                  ptr[uVar28][0] = e.m[0];
                  ptr[uVar28][1] = e.m[1];
                  iVar31 = iVar31 - gap;
                }
                *ptr_00 = 0;
                for (uVar28 = 1; s2Len + 1 != uVar28; uVar28 = uVar28 + 1) {
                  iVar27 = 0;
                  if (s2_beg == 0) {
                    iVar27 = iVar34;
                  }
                  ptr_00[uVar28] = iVar27;
                  iVar34 = iVar34 - gap;
                }
                iVar31 = -open;
                iVar34 = -open;
                iVar32 = -open;
                iVar45 = -open;
                uVar38 = uVar15;
                uVar39 = uVar15;
                uVar40 = uVar15;
                uVar41 = uVar15;
                for (uVar20 = uVar29 - 1; -1 < (int)uVar20; uVar20 = uVar20 - 1) {
                  palVar30 = ptr_03 + uVar20;
                  *(int *)*palVar30 = iVar31;
                  *(int *)((long)*palVar30 + 4) = iVar34;
                  *(int *)(*palVar30 + 1) = iVar32;
                  *(int *)((long)*palVar30 + 0xc) = iVar45;
                  iVar31 = iVar31 - gap;
                  iVar34 = iVar34 - gap;
                  iVar32 = iVar32 - gap;
                  iVar45 = iVar45 - gap;
                  uVar38 = (uint)(iVar31 < (int)uVar38) * iVar31 | (iVar31 >= (int)uVar38) * uVar38;
                  uVar39 = (uint)(iVar34 < (int)uVar39) * iVar34 | (iVar34 >= (int)uVar39) * uVar39;
                  uVar40 = (uint)(iVar32 < (int)uVar40) * iVar32 | (iVar32 >= (int)uVar40) * uVar40;
                  uVar41 = (uint)(iVar45 < (int)uVar41) * iVar45 | (iVar45 >= (int)uVar41) * uVar41;
                }
                palVar30 = ptr_02 + (uVar29 - 1);
                uVar28 = 0;
                auVar42 = auVar36;
                auVar47 = auVar36;
                iVar31 = iVar17;
                while (uVar28 != (uint)s2Len) {
                  iVar34 = ppVar7->mapper[(byte)s2[uVar28]];
                  uVar20 = uVar18 - (int)(*ptr_03)[0];
                  uVar57 = uVar18 - *(int *)((long)*ptr_03 + 4);
                  uVar60 = uVar18 - (int)(*ptr_03)[1];
                  uVar63 = uVar18 - *(int *)((long)*ptr_03 + 0xc);
                  lVar22 = 0;
                  auVar51 = auVar36;
                  iVar27 = ptr_00[uVar28];
                  iVar32 = (int)(*palVar30)[0];
                  iVar45 = *(int *)((long)*palVar30 + 4);
                  iVar49 = (int)(*palVar30)[1];
                  while( true ) {
                    iVar66 = auVar51._0_4_;
                    iVar59 = auVar51._4_4_;
                    iVar62 = auVar51._8_4_;
                    iVar67 = auVar51._12_4_;
                    if (uVar33 << 4 == lVar22) break;
                    piVar2 = (int *)((long)*ptr_02 + lVar22);
                    iVar65 = *piVar2;
                    iVar9 = piVar2[1];
                    iVar10 = piVar2[2];
                    iVar11 = piVar2[3];
                    piVar2 = (int *)((long)*ptr + lVar22);
                    iVar68 = *piVar2 - gap;
                    iVar69 = piVar2[1] - gap;
                    iVar70 = piVar2[2] - gap;
                    iVar71 = piVar2[3] - gap;
                    iVar72 = iVar65 - open;
                    iVar74 = iVar9 - open;
                    iVar76 = iVar10 - open;
                    iVar78 = iVar11 - open;
                    piVar2 = (int *)((long)pvVar6 + lVar22 + (long)(int)(iVar34 * uVar29) * 0x10);
                    iVar48 = iVar27 + *piVar2;
                    iVar32 = iVar32 + piVar2[1];
                    iVar45 = iVar45 + piVar2[2];
                    iVar49 = iVar49 + piVar2[3];
                    piVar2 = (int *)((long)*ptr_03 + lVar22);
                    iVar56 = uVar20 + *piVar2;
                    iVar58 = uVar57 + piVar2[1];
                    iVar61 = uVar60 + piVar2[2];
                    iVar64 = uVar63 + piVar2[3];
                    uVar73 = (uint)(iVar72 < iVar68) * iVar68 | (uint)(iVar72 >= iVar68) * iVar72;
                    uVar75 = (uint)(iVar74 < iVar69) * iVar69 | (uint)(iVar74 >= iVar69) * iVar74;
                    uVar77 = (uint)(iVar76 < iVar70) * iVar70 | (uint)(iVar76 >= iVar70) * iVar76;
                    uVar79 = (uint)(iVar78 < iVar71) * iVar71 | (uint)(iVar78 >= iVar71) * iVar78;
                    auVar51._0_4_ =
                         (uint)(iVar66 < iVar56) * iVar56 | (uint)(iVar66 >= iVar56) * iVar66;
                    auVar51._4_4_ =
                         (uint)(iVar59 < iVar58) * iVar58 | (uint)(iVar59 >= iVar58) * iVar59;
                    auVar51._8_4_ =
                         (uint)(iVar62 < iVar61) * iVar61 | (uint)(iVar62 >= iVar61) * iVar62;
                    auVar51._12_4_ =
                         (uint)(iVar67 < iVar64) * iVar64 | (uint)(iVar67 >= iVar64) * iVar67;
                    uVar20 = (iVar48 < (int)uVar73) * uVar73 |
                             (uint)(iVar48 >= (int)uVar73) * iVar48;
                    uVar57 = (iVar32 < (int)uVar75) * uVar75 |
                             (uint)(iVar32 >= (int)uVar75) * iVar32;
                    uVar60 = (iVar45 < (int)uVar77) * uVar77 |
                             (uint)(iVar45 >= (int)uVar77) * iVar45;
                    uVar63 = (iVar49 < (int)uVar79) * uVar79 |
                             (uint)(iVar49 >= (int)uVar79) * iVar49;
                    puVar3 = (uint *)((long)*ptr + lVar22);
                    *puVar3 = uVar73;
                    puVar3[1] = uVar75;
                    puVar3[2] = uVar77;
                    puVar3[3] = uVar79;
                    puVar3 = (uint *)((long)*ptr_01 + lVar22);
                    *puVar3 = uVar20;
                    puVar3[1] = uVar57;
                    puVar3[2] = uVar60;
                    puVar3[3] = uVar63;
                    lVar22 = lVar22 + 0x10;
                    iVar27 = iVar65;
                    iVar32 = iVar9;
                    iVar45 = iVar10;
                    iVar49 = iVar11;
                  }
                  uVar1 = uVar28 + 1;
                  iVar34 = ptr_00[uVar28 + 1];
                  iVar32 = (int)(*ptr_03)[0] + iVar34;
                  iVar45 = *(int *)((long)*ptr_03 + 4) + uVar20;
                  iVar49 = (int)(*ptr_03)[1] + uVar57;
                  iVar65 = *(int *)((long)*ptr_03 + 0xc) + uVar60;
                  auVar52._0_4_ =
                       (uint)(iVar66 < iVar32) * iVar32 | (uint)(iVar66 >= iVar32) * iVar66;
                  auVar52._4_4_ =
                       (uint)(iVar59 < iVar45) * iVar45 | (uint)(iVar59 >= iVar45) * iVar59;
                  auVar52._8_4_ =
                       (uint)(iVar62 < iVar49) * iVar49 | (uint)(iVar62 >= iVar49) * iVar62;
                  auVar52._12_4_ =
                       (uint)(iVar67 < iVar65) * iVar65 | (uint)(iVar67 >= iVar65) * iVar67;
                  iVar32 = 2;
                  while( true ) {
                    bVar35 = iVar32 == 0;
                    iVar32 = iVar32 + -1;
                    uVar63 = auVar52._0_4_;
                    uVar73 = auVar52._4_4_;
                    uVar75 = auVar52._8_4_;
                    if (bVar35) break;
                    iVar45 = uVar63 + iVar19;
                    iVar49 = uVar73 + iVar19;
                    iVar66 = uVar75 + iVar19;
                    auVar53._0_4_ =
                         ((int)uVar63 < (int)uVar18) * uVar18 |
                         ((int)uVar63 >= (int)uVar18) * uVar63;
                    auVar53._4_4_ =
                         (uint)((int)uVar73 < iVar45) * iVar45 | ((int)uVar73 >= iVar45) * uVar73;
                    iVar45 = auVar52._12_4_;
                    auVar53._8_4_ =
                         (uint)((int)uVar75 < iVar49) * iVar49 | ((int)uVar75 >= iVar49) * uVar75;
                    auVar53._12_4_ =
                         (uint)(iVar45 < iVar66) * iVar66 | (uint)(iVar45 >= iVar66) * iVar45;
                    auVar52 = auVar53;
                  }
                  uVar77 = (iVar34 < (int)uVar18) * uVar18 | (uint)(iVar34 >= (int)uVar18) * iVar34;
                  uVar79 = ((int)uVar20 < (int)uVar63) * uVar63 |
                           ((int)uVar20 >= (int)uVar63) * uVar20;
                  uVar57 = ((int)uVar57 < (int)uVar73) * uVar73 |
                           ((int)uVar57 >= (int)uVar73) * uVar57;
                  uVar60 = ((int)uVar60 < (int)uVar75) * uVar75 |
                           ((int)uVar60 >= (int)uVar75) * uVar60;
                  uVar20 = uVar18;
                  for (lVar22 = 0; uVar33 << 4 != lVar22; lVar22 = lVar22 + 0x10) {
                    iVar66 = uVar20 - gap;
                    iVar59 = uVar63 - gap;
                    iVar62 = uVar73 - gap;
                    iVar67 = uVar75 - gap;
                    iVar34 = uVar77 - open;
                    iVar32 = uVar79 - open;
                    iVar45 = uVar57 - open;
                    iVar49 = uVar60 - open;
                    uVar20 = (uint)(iVar66 < iVar34) * iVar34 | (uint)(iVar66 >= iVar34) * iVar66;
                    uVar63 = (uint)(iVar59 < iVar32) * iVar32 | (uint)(iVar59 >= iVar32) * iVar59;
                    uVar73 = (uint)(iVar62 < iVar45) * iVar45 | (uint)(iVar62 >= iVar45) * iVar62;
                    uVar75 = (uint)(iVar67 < iVar49) * iVar49 | (uint)(iVar67 >= iVar49) * iVar67;
                    piVar2 = (int *)((long)*ptr_01 + lVar22);
                    iVar34 = *piVar2;
                    iVar32 = piVar2[1];
                    iVar45 = piVar2[2];
                    iVar49 = piVar2[3];
                    uVar77 = (iVar34 < (int)uVar20) * uVar20 |
                             (uint)(iVar34 >= (int)uVar20) * iVar34;
                    uVar79 = (iVar32 < (int)uVar63) * uVar63 |
                             (uint)(iVar32 >= (int)uVar63) * iVar32;
                    uVar57 = (iVar45 < (int)uVar73) * uVar73 |
                             (uint)(iVar45 >= (int)uVar73) * iVar45;
                    uVar60 = (iVar49 < (int)uVar75) * uVar75 |
                             (uint)(iVar49 >= (int)uVar75) * iVar49;
                    puVar3 = (uint *)((long)*ptr_02 + lVar22);
                    *puVar3 = uVar77;
                    puVar3[1] = uVar79;
                    puVar3[2] = uVar57;
                    puVar3[3] = uVar60;
                    uVar38 = ((int)uVar20 < (int)uVar38) * uVar20 |
                             ((int)uVar20 >= (int)uVar38) * uVar38;
                    uVar39 = ((int)uVar63 < (int)uVar39) * uVar63 |
                             ((int)uVar63 >= (int)uVar39) * uVar39;
                    uVar40 = ((int)uVar73 < (int)uVar40) * uVar73 |
                             ((int)uVar73 >= (int)uVar40) * uVar40;
                    uVar41 = ((int)uVar75 < (int)uVar41) * uVar75 |
                             ((int)uVar75 >= (int)uVar41) * uVar41;
                    uVar38 = ((int)uVar77 < (int)uVar38) * uVar77 |
                             ((int)uVar77 >= (int)uVar38) * uVar38;
                    uVar39 = ((int)uVar79 < (int)uVar39) * uVar79 |
                             ((int)uVar79 >= (int)uVar39) * uVar39;
                    uVar40 = ((int)uVar57 < (int)uVar40) * uVar57 |
                             ((int)uVar57 >= (int)uVar40) * uVar40;
                    uVar41 = ((int)uVar60 < (int)uVar41) * uVar60 |
                             ((int)uVar60 >= (int)uVar41) * uVar41;
                    iVar34 = auVar42._0_4_;
                    auVar43._0_4_ =
                         (iVar34 < (int)uVar77) * uVar77 | (uint)(iVar34 >= (int)uVar77) * iVar34;
                    iVar34 = auVar42._4_4_;
                    auVar43._4_4_ =
                         (iVar34 < (int)uVar79) * uVar79 | (uint)(iVar34 >= (int)uVar79) * iVar34;
                    iVar34 = auVar42._8_4_;
                    iVar32 = auVar42._12_4_;
                    auVar43._8_4_ =
                         (iVar34 < (int)uVar57) * uVar57 | (uint)(iVar34 >= (int)uVar57) * iVar34;
                    auVar43._12_4_ =
                         (iVar32 < (int)uVar60) * uVar60 | (uint)(iVar32 >= (int)uVar60) * iVar32;
                    auVar42 = auVar43;
                  }
                  alVar55 = ptr_02[(ulong)uVar25 % uVar33];
                  iVar32 = auVar47._0_4_;
                  iVar59 = (int)alVar55[0];
                  auVar54._0_4_ = -(uint)(iVar32 < iVar59);
                  iVar45 = auVar47._4_4_;
                  iVar62 = alVar55[0]._4_4_;
                  auVar54._4_4_ = -(uint)(iVar45 < iVar62);
                  iVar49 = auVar47._8_4_;
                  iVar67 = (int)alVar55[1];
                  iVar65 = alVar55[1]._4_4_;
                  auVar54._8_4_ = -(uint)(iVar49 < iVar67);
                  iVar66 = auVar47._12_4_;
                  auVar54._12_4_ = -(uint)(iVar66 < iVar65);
                  auVar8._4_4_ = -(uint)(iVar24 == 2);
                  auVar8._0_4_ = -(uint)(iVar24 == 3);
                  auVar8._8_4_ = -(uint)(iVar24 == 1);
                  auVar8._12_4_ = -(uint)(iVar21 == 3);
                  auVar54 = auVar54 & auVar8;
                  iVar34 = 0;
                  while( true ) {
                    uVar50 = alVar55[0];
                    lVar22 = alVar55[1];
                    if (iVar24 <= iVar34) break;
                    alVar55[0] = uVar50 << 0x20;
                    alVar55[1] = lVar22 << 0x20 | uVar50 >> 0x20;
                    iVar34 = iVar34 + 1;
                  }
                  ((ppVar16->field_4).rowcols)->score_row[uVar28] = alVar55[1]._4_4_;
                  auVar47._0_4_ =
                       (uint)(iVar32 < iVar59) * iVar59 | (uint)(iVar32 >= iVar59) * iVar32;
                  auVar47._4_4_ =
                       (uint)(iVar45 < iVar62) * iVar62 | (uint)(iVar45 >= iVar62) * iVar45;
                  auVar47._8_4_ =
                       (uint)(iVar49 < iVar67) * iVar67 | (uint)(iVar49 >= iVar67) * iVar49;
                  auVar47._12_4_ =
                       (uint)(iVar66 < iVar65) * iVar65 | (uint)(iVar66 >= iVar65) * iVar66;
                  iVar34 = (int)uVar28;
                  uVar28 = uVar1;
                  if ((((((((((((((((auVar54 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar54 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar54 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar54 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar54 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar54 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar54 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar54 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar54 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar54 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar54 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar54 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar54 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar54[0xf] < '\0') {
                    iVar31 = iVar34;
                  }
                }
                for (lVar22 = 0; uVar33 * 4 != lVar22; lVar22 = lVar22 + 4) {
                  puVar4 = (undefined4 *)((long)*ptr_02 + lVar22 * 4);
                  uVar12 = puVar4[1];
                  uVar13 = puVar4[2];
                  uVar14 = puVar4[3];
                  piVar2 = ((ppVar16->field_4).rowcols)->score_col;
                  *(undefined4 *)((long)piVar2 + lVar22) = *puVar4;
                  *(undefined4 *)((long)piVar2 + uVar33 * 4 + lVar22) = uVar12;
                  *(undefined4 *)((long)piVar2 + uVar33 * 8 + lVar22) = uVar13;
                  *(undefined4 *)((long)piVar2 + uVar33 * 0xc + lVar22) = uVar14;
                }
                local_c8 = uVar18;
                if (s2_end != 0) {
                  iVar21 = 0;
                  while( true ) {
                    uVar28 = auVar47._0_8_;
                    lVar22 = auVar47._8_8_;
                    if (iVar24 <= iVar21) break;
                    auVar47._0_8_ = uVar28 << 0x20;
                    auVar47._8_8_ = lVar22 << 0x20 | uVar28 >> 0x20;
                    iVar21 = iVar21 + 1;
                  }
                  local_c8 = auVar47._12_4_;
                }
                uVar20 = uVar25;
                if (s1_end != 0) {
                  for (uVar28 = 0; (uVar29 & 0x1fffffff) << 2 != (uint)uVar28; uVar28 = uVar28 + 1)
                  {
                    uVar57 = ((uint)uVar28 & 3) * uVar29 + ((uint)(uVar28 >> 2) & 0x3fffffff);
                    iVar21 = iVar31;
                    uVar60 = uVar20;
                    uVar63 = local_c8;
                    if (((int)uVar57 < (int)uVar5) &&
                       (uVar73 = *(uint *)((long)*ptr_02 + uVar28 * 4), iVar21 = iVar17,
                       uVar60 = uVar57, uVar63 = uVar73, (int)uVar73 <= (int)local_c8)) {
                      if ((int)uVar20 <= (int)uVar57) {
                        uVar57 = uVar20;
                      }
                      iVar21 = iVar31;
                      uVar60 = uVar20;
                      uVar63 = local_c8;
                      if (iVar31 == iVar17 && uVar73 == local_c8) {
                        uVar60 = uVar57;
                      }
                    }
                    local_c8 = uVar63;
                    uVar20 = uVar60;
                    iVar31 = iVar21;
                  }
                }
                if (s2_end == 0 && s1_end == 0) {
                  alVar46 = ptr_02[(ulong)uVar25 % uVar33];
                  s1_end = 0;
                  while( true ) {
                    uVar33 = alVar46[0];
                    lVar22 = alVar46[1];
                    if (iVar24 <= s1_end) break;
                    alVar46[0] = uVar33 << 0x20;
                    alVar46[1] = lVar22 << 0x20 | uVar33 >> 0x20;
                    s1_end = s1_end + 1;
                  }
                  local_c8 = alVar46[1]._4_4_;
                  iVar31 = iVar17;
                  uVar20 = uVar25;
                }
                auVar37._0_4_ = -(uint)((int)uVar38 < (int)uVar18);
                auVar37._4_4_ = -(uint)((int)uVar39 < (int)uVar18);
                auVar37._8_4_ = -(uint)((int)uVar40 < (int)uVar18);
                auVar37._12_4_ = -(uint)((int)uVar41 < (int)uVar18);
                auVar44._0_4_ = -(uint)((int)uVar15 < auVar42._0_4_);
                auVar44._4_4_ = -(uint)((int)uVar15 < auVar42._4_4_);
                auVar44._8_4_ = -(uint)((int)uVar15 < auVar42._8_4_);
                auVar44._12_4_ = -(uint)((int)uVar15 < auVar42._12_4_);
                iVar21 = movmskps(s1_end,auVar44 | auVar37);
                if (iVar21 != 0) {
                  *(byte *)&ppVar16->flag = (byte)ppVar16->flag | 0x40;
                  local_c8 = 0;
                  iVar31 = 0;
                  uVar20 = 0;
                }
                ppVar16->score = local_c8;
                ppVar16->end_query = uVar20;
                ppVar16->end_ref = iVar31;
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr);
                return ppVar16;
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar23 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_rowcol_scan_profile_sse41_128_32",pcVar23);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHp = _mm_insert_epi32(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vE, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vHp = _mm_add_epi32(vHp, vW);
            vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[i]));
            vHt = _mm_max_epi32(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHt = _mm_insert_epi32(vHt, boundary[j+1], 0);
        vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            vF = _mm_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        vH = _mm_max_epi32(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vF, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vH = _mm_max_epi32(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm_max_epi32(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
        }
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            score = (int32_t) _mm_extract_epi32 (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}